

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_MapIterator_Done(upb_Map *map,size_t iter)

{
  undefined1 local_30 [8];
  upb_strtable_iter i;
  size_t iter_local;
  upb_Map *map_local;
  
  i.index = iter;
  if (iter != 0xffffffffffffffff) {
    if ((map->is_strtable_dont_copy_me__upb_internal_use_only & 1U) == 0) {
      map_local._7_1_ = upb_inttable_done(&(map->t).inttable,iter);
    }
    else {
      local_30 = (undefined1  [8])&map->t;
      i.t = (upb_strtable *)iter;
      map_local._7_1_ = upb_strtable_done((upb_strtable_iter *)local_30);
    }
    return map_local._7_1_;
  }
  __assert_fail("iter != ((size_t)-1)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                ,0x79,"_Bool upb_MapIterator_Done(const upb_Map *, size_t)");
}

Assistant:

bool upb_MapIterator_Done(const upb_Map* map, size_t iter) {
  UPB_ASSERT(iter != kUpb_Map_Begin);
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_strtable_iter i;
    i.t = &map->t.strtable;
    i.index = iter;
    return upb_strtable_done(&i);
  } else {
    return upb_inttable_done(&map->t.inttable, iter);
  }
}